

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O1

void * internal_memalign(mstate m,size_t alignment,size_t bytes)

{
  byte *pbVar1;
  int iVar2;
  void *pvVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  mstate psize;
  mstate pmVar7;
  mstate pmVar8;
  uint uVar9;
  mchunkptr p;
  ulong uVar10;
  
  if (m < (mstate)0x21) {
    m = (mstate)&DAT_00000020;
  }
  pmVar8 = (mstate)&DAT_00000020;
  pmVar7 = m;
  if (((ulong)m & (ulong)((long)&m[-1].exts + 7U)) != 0) {
    do {
      pmVar7 = pmVar8;
      pmVar8 = (mstate)((long)pmVar7 * 2);
    } while (pmVar7 < m);
  }
  if (alignment < -(long)pmVar7 - 0x80U) {
    uVar10 = 0x20;
    if (0x16 < alignment) {
      uVar10 = alignment + 0x17 & 0xfffffffffffffff0;
    }
    pvVar3 = malloc((long)pmVar7->smallbins + (uVar10 - 0x30));
    iVar2 = _gm_.mutex;
    if (pvVar3 != (void *)0x0) {
      if (((byte)_gm_.mflags & 2) != 0) {
        uVar9 = 1;
        LOCK();
        _gm_.mutex = 1;
        UNLOCK();
        if (iVar2 != 0) {
          while (_gm_.mutex != 0) {
            if ((uVar9 & 0x3f) == 0) {
              sched_yield();
            }
            uVar9 = uVar9 + 1;
          }
          LOCK();
          _gm_.mutex = 1;
          UNLOCK();
        }
      }
      pmVar8 = (mstate)((long)pvVar3 + -0x10);
      if (((ulong)((long)&pmVar7[-1].exts + 7U) & (ulong)pvVar3) != 0) {
        uVar6 = -(long)pmVar7 & (ulong)((undefined1 *)((long)pvVar3 + (long)pmVar7) + -1);
        psize = (mstate)0x0;
        if ((uVar6 - 0x10) - (long)pmVar8 < 0x20) {
          psize = pmVar7;
        }
        pmVar7 = (mstate)((long)psize->smallbins + (uVar6 - 0x58));
        p = (mchunkptr)((long)pmVar7 - (long)pmVar8);
        uVar5 = (*(ulong *)((long)pvVar3 + -8) & 0xfffffffffffffff8) - (long)p;
        if ((*(ulong *)((long)pvVar3 + -8) & 3) == 0) {
          *(long *)pmVar7 = (long)&p->prev_foot + *(long *)pmVar8;
          *(ulong *)((long)psize->smallbins + (uVar6 - 0x50)) = uVar5;
          pmVar8 = pmVar7;
        }
        else {
          *(ulong *)((long)psize->smallbins + (uVar6 - 0x50)) =
               (uint)*(undefined8 *)((long)psize->smallbins + (uVar6 - 0x50)) & 1 | uVar5 | 2;
          pbVar1 = (byte *)((long)psize + uVar5 + (uVar6 - 8));
          *pbVar1 = *pbVar1 | 1;
          *(ulong *)((long)pvVar3 + -8) =
               (ulong)((uint)*(undefined8 *)((long)pvVar3 + -8) & 1) | (ulong)p | 2;
          pbVar1 = (byte *)((long)pvVar3 + -8 + (long)p);
          *pbVar1 = *pbVar1 | 1;
          dispose_chunk(pmVar8,p,(size_t)psize);
          pmVar8 = pmVar7;
        }
      }
      uVar6 = pmVar8->dvsize;
      if ((uVar6 & 3) != 0) {
        uVar5 = uVar6 & 0xfffffffffffffff8;
        if (uVar10 + 0x20 < uVar5) {
          pmVar8->dvsize = ((uint)uVar6 & 1) + uVar10 + 2;
          *(ulong *)((long)pmVar8->smallbins + (uVar10 - 0x40)) = uVar5 - uVar10 | 3;
          pbVar1 = (byte *)((long)pmVar8->smallbins + (uVar5 - 0x40));
          *pbVar1 = *pbVar1 | 1;
          dispose_chunk((mstate)((long)pmVar8->smallbins + (uVar10 - 0x48)),
                        (mchunkptr)(uVar5 - uVar10),uVar10 + 0x20);
        }
      }
      if (((byte)_gm_.mflags & 2) == 0) {
        return &pmVar8->topsize;
      }
      _gm_.mutex = 0;
      return &pmVar8->topsize;
    }
  }
  else {
    piVar4 = _PDCLIB_errno_func();
    *piVar4 = 0xc;
  }
  return (void *)0x0;
}

Assistant:

static void* internal_memalign(mstate m, size_t alignment, size_t bytes) {
  void* mem = 0;
  if (alignment <  MIN_CHUNK_SIZE) /* must be at least a minimum chunk size */
    alignment = MIN_CHUNK_SIZE;
  if ((alignment & (alignment-SIZE_T_ONE)) != 0) {/* Ensure a power of 2 */
    size_t a = MALLOC_ALIGNMENT << 1;
    while (a < alignment) a <<= 1;
    alignment = a;
  }
  if (bytes >= MAX_REQUEST - alignment) {
    if (m != 0)  { /* Test isn't needed but avoids compiler warning */
      MALLOC_FAILURE_ACTION;
    }
  }
  else {
    size_t nb = request2size(bytes);
    size_t req = nb + alignment + MIN_CHUNK_SIZE - CHUNK_OVERHEAD;
    mem = internal_malloc(m, req);
    if (mem != 0) {
      mchunkptr p = mem2chunk(mem);
      if (PREACTION(m))
        return 0;
      if ((((size_t)(mem)) & (alignment - 1)) != 0) { /* misaligned */
        /*
          Find an aligned spot inside chunk.  Since we need to give
          back leading space in a chunk of at least MIN_CHUNK_SIZE, if
          the first calculation places us at a spot with less than
          MIN_CHUNK_SIZE leader, we can move to the next aligned spot.
          We've allocated enough total room so that this is always
          possible.
        */
        char* br = (char*)mem2chunk((size_t)(((size_t)((char*)mem + alignment -
                                                       SIZE_T_ONE)) &
                                             -alignment));
        char* pos = ((size_t)(br - (char*)(p)) >= MIN_CHUNK_SIZE)?
          br : br+alignment;
        mchunkptr newp = (mchunkptr)pos;
        size_t leadsize = pos - (char*)(p);
        size_t newsize = chunksize(p) - leadsize;

        if (is_mmapped(p)) { /* For mmapped chunks, just adjust offset */
          newp->prev_foot = p->prev_foot + leadsize;
          newp->head = newsize;
        }
        else { /* Otherwise, give back leader, use the rest */
          set_inuse(m, newp, newsize);
          set_inuse(m, p, leadsize);
          dispose_chunk(m, p, leadsize);
        }
        p = newp;
      }

      /* Give back spare room at the end */
      if (!is_mmapped(p)) {
        size_t size = chunksize(p);
        if (size > nb + MIN_CHUNK_SIZE) {
          size_t remainder_size = size - nb;
          mchunkptr remainder = chunk_plus_offset(p, nb);
          set_inuse(m, p, nb);
          set_inuse(m, remainder, remainder_size);
          dispose_chunk(m, remainder, remainder_size);
        }
      }

      mem = chunk2mem(p);
      assert (chunksize(p) >= nb);
      assert(((size_t)mem & (alignment - 1)) == 0);
      check_inuse_chunk(m, p);
      POSTACTION(m);
    }
  }
  return mem;
}